

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O1

void test_not_found(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  undefined1 local_70 [8];
  nni_id_map m;
  uint64_t id;
  
  nni_id_map_init((nni_id_map *)local_70,0,0,false);
  nVar1 = nni_id_alloc((nni_id_map *)local_70,(uint64_t *)&m.id_entries,&m.id_entries);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,100,"%s: expected success, got %s (%d)","nni_id_alloc(&m, &id, &id)",
                         pcVar3,nVar1);
  if (iVar2 != 0) {
    num = nni_id_remove((nni_id_map *)local_70,0x2a);
    pcVar3 = nng_strerror(NNG_ENOENT);
    acutest_check_((uint)(num == NNG_ENOENT),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                   ,0x65,"%s fails with %s","nni_id_remove(&m, 42)",pcVar3,nVar1);
    pcVar3 = nng_strerror(NNG_ENOENT);
    pcVar4 = nng_strerror(num);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nni_id_remove(&m, 42)",pcVar3,0xc,pcVar4,
                     (ulong)num);
    nVar1 = nni_id_remove((nni_id_map *)local_70,2);
    pcVar3 = nng_strerror(NNG_ENOENT);
    acutest_check_((uint)(nVar1 == NNG_ENOENT),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                   ,0x66,"%s fails with %s","nni_id_remove(&m, 2)",pcVar3);
    pcVar3 = nng_strerror(NNG_ENOENT);
    pcVar4 = nng_strerror(nVar1);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nni_id_remove(&m, 2)",pcVar3,0xc,pcVar4,
                     (ulong)nVar1);
    nVar1 = nni_id_remove((nni_id_map *)local_70,(uint64_t)m.id_entries);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                           ,0x67,"%s: expected success, got %s (%d)","nni_id_remove(&m, id)",pcVar3,
                           nVar1);
    if (iVar2 != 0) {
      nni_id_map_fini((nni_id_map *)local_70);
      return;
    }
  }
  acutest_abort_();
}

Assistant:

void
test_not_found(void)
{
	nni_id_map m;
	uint64_t   id;
	nni_id_map_init(&m, 0, 0, false);

	NUTS_PASS(nni_id_alloc(&m, &id, &id));
	NUTS_FAIL(nni_id_remove(&m, 42), NNG_ENOENT);
	NUTS_FAIL(nni_id_remove(&m, 2), NNG_ENOENT);
	NUTS_PASS(nni_id_remove(&m, id));
	nni_id_map_fini(&m);
}